

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O1

double polymul_internal::polynomial_evaluator<double,_double,_2,_5>::eval_monomial
                 (double *p,double *x)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  dVar1 = *x;
  dVar4 = polynomial_evaluator<double,_double,_2,_4>::eval_monomial(p,x);
  iVar3 = 4;
  iVar2 = binomial(5,4);
  dVar5 = x[1];
  do {
    dVar5 = dVar5 * x[1];
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return dVar1 * dVar4 + dVar5 * p[iVar2];
}

Assistant:

static vartype eval_monomial(const numtype p[], const vartype x[]) {
    return x[0] *
               polynomial_evaluator<numtype, vartype, Nvar, Ndeg - 1>::eval_monomial(
                   p, x) +
           polynomial_evaluator<numtype, vartype, Nvar - 1, Ndeg>::eval_monomial(
               p + binomial(Nvar + Ndeg - 2, Ndeg - 1), x + 1);
  }